

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O1

string * __thiscall
EOPlus::token_got_string_abi_cxx11_(string *__return_storage_ptr__,EOPlus *this,Token *t)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  char *pcVar8;
  char *pcVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  string local_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  ulong local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  string local_38;
  
  iVar1 = *(int *)this;
  if (iVar1 < 0x10) {
    switch(iVar1) {
    case 0:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "invalid token";
      pcVar8 = "";
      goto LAB_0013e849;
    case 1:
      util::variant::GetString_abi_cxx11_(&local_98,(variant *)(this + 8));
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x1a68df);
      local_78 = &local_68;
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_68 = *plVar6;
        lStack_60 = plVar5[3];
      }
      else {
        local_68 = *plVar6;
        local_78 = (long *)*plVar5;
      }
      local_70 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
      break;
    case 2:
      util::variant::GetString_abi_cxx11_(&local_38,(variant *)(this + 8));
      if (local_38._M_string_length < 0x11) {
        local_58 = &local_48;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p == &local_38.field_2) {
          local_48._8_8_ = local_38.field_2._8_8_;
        }
        else {
          local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_38._M_dataplus._M_p;
        }
        local_48._M_allocated_capacity._1_7_ = local_38.field_2._M_allocated_capacity._1_7_;
        local_48._M_local_buf[0] = local_38.field_2._M_local_buf[0];
        local_50 = local_38._M_string_length;
        local_38._M_string_length = 0;
        local_38.field_2._M_local_buf[0] = '\0';
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_78,(ulong)&local_38);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
        local_58 = &local_48;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_48._M_allocated_capacity = *psVar7;
          local_48._8_8_ = plVar5[3];
        }
        else {
          local_48._M_allocated_capacity = *psVar7;
          local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar5;
        }
        local_50 = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_78 != &local_68) {
          operator_delete(local_78,local_68 + 1);
        }
      }
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x1a68ec);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_98.field_2._M_allocated_capacity = *psVar7;
        local_98.field_2._8_8_ = plVar5[3];
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar7;
        local_98._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_98._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar7) {
        lVar2 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (local_58 != &local_48) {
        operator_delete(local_58,local_48._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return __return_storage_ptr__;
      }
      uVar10 = CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                        local_38.field_2._M_local_buf[0]);
      _Var11._M_p = local_38._M_dataplus._M_p;
      goto LAB_0013ed17;
    default:
      goto switchD_0013e51b_caseD_3;
    case 4:
      util::variant::GetString_abi_cxx11_(&local_98,(variant *)(this + 8));
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x1a68f5);
      local_78 = &local_68;
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_68 = *plVar6;
        lStack_60 = plVar5[3];
      }
      else {
        local_68 = *plVar6;
        local_78 = (long *)*plVar5;
      }
      local_70 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
      break;
    case 8:
      util::variant::GetString_abi_cxx11_(&local_98,(variant *)(this + 8));
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x1a68ff);
      local_78 = &local_68;
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_68 = *plVar6;
        lStack_60 = plVar5[3];
      }
      else {
        local_68 = *plVar6;
        local_78 = (long *)*plVar5;
      }
      local_70 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
    }
LAB_0013e94a:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar7) {
      lVar2 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    uVar10 = local_98.field_2._M_allocated_capacity;
    _Var11._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_0013ed17;
  }
  if (0x3f < iVar1) {
    if (iVar1 == 0x40) {
      util::variant::GetString_abi_cxx11_(&local_98,(variant *)(this + 8));
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x1a691c);
      local_78 = &local_68;
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_68 = *plVar6;
        lStack_60 = plVar5[3];
      }
      else {
        local_68 = *plVar6;
        local_78 = (long *)*plVar5;
      }
      local_70 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
      goto LAB_0013e94a;
    }
    if (iVar1 == 0x80) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "new-line";
      pcVar8 = "";
      goto LAB_0013e849;
    }
    if (iVar1 == 0x100) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "end of file";
      pcVar8 = "";
      goto LAB_0013e849;
    }
switchD_0013e51b_caseD_3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "unknown token";
    pcVar8 = "";
LAB_0013e849:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar9,pcVar8);
    return __return_storage_ptr__;
  }
  if (iVar1 == 0x10) {
    bVar3 = util::variant::GetBool((variant *)(this + 8));
    pcVar8 = "false";
    if (bVar3) {
      pcVar8 = "true";
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,pcVar8,pcVar8 + ((ulong)bVar3 ^ 5));
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x1a6907);
    local_78 = &local_68;
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_68 = *plVar6;
      lStack_60 = plVar5[3];
    }
    else {
      local_68 = *plVar6;
      local_78 = (long *)*plVar5;
    }
    local_70 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
    goto LAB_0013ecb3;
  }
  if (iVar1 != 0x20) goto switchD_0013e51b_caseD_3;
  uVar4 = util::variant::GetInt((variant *)(this + 8));
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  uVar4 = uVar4 & 0xff;
  if (0x4b < uVar4) {
    if (uVar4 < 0x5e) {
      if (uVar4 == 0x4c) {
        local_98.field_2._M_allocated_capacity._0_2_ = 0x7c7c;
        goto LAB_0013ec36;
      }
      if (uVar4 != 0x5c) goto switchD_0013e5c1_caseD_2;
      local_98.field_2._M_allocated_capacity._0_2_ = 0x7c;
    }
    else {
      if (uVar4 != 0x5e) {
        if (uVar4 == 0x9e) {
          local_98.field_2._M_allocated_capacity._0_2_ = 0x2626;
        }
        else {
          if (uVar4 != 0xf5) goto switchD_0013e5c1_caseD_2;
          local_98.field_2._M_allocated_capacity._0_2_ = 0x3d21;
        }
        goto LAB_0013ec36;
      }
      local_98.field_2._M_allocated_capacity._0_2_ = 0x7e;
    }
    goto LAB_0013ec24;
  }
  switch(uVar4) {
  case 1:
    local_98.field_2._M_allocated_capacity._0_2_ = 0x21;
    break;
  default:
switchD_0013e5c1_caseD_2:
    local_98.field_2._M_allocated_capacity = 0x6e776f6e6b6e7528;
    local_98._M_string_length = 9;
    local_98.field_2._8_2_ = 0x29;
    goto LAB_0013ec44;
  case 5:
    local_98.field_2._M_allocated_capacity._0_2_ = 0x25;
    break;
  case 6:
    local_98.field_2._M_allocated_capacity._0_2_ = 0x26;
    break;
  case 8:
    local_98.field_2._M_allocated_capacity._0_2_ = 0x28;
    break;
  case 9:
    local_98.field_2._M_allocated_capacity._0_2_ = 0x29;
    break;
  case 10:
    local_98.field_2._M_allocated_capacity._0_2_ = 0x2a;
    break;
  case 0xb:
    local_98.field_2._M_allocated_capacity._0_2_ = 0x2b;
    break;
  case 0xd:
  case 0x15:
    local_98.field_2._M_allocated_capacity._0_2_ = 0x2d;
    break;
  case 0xf:
    local_98.field_2._M_allocated_capacity._0_2_ = 0x2f;
    break;
  case 0x10:
    local_98.field_2._M_allocated_capacity._0_2_ = 0x3d3c;
    goto LAB_0013ec36;
  case 0x11:
    local_98.field_2._M_allocated_capacity._0_2_ = 0x3d3d;
    goto LAB_0013ec36;
  case 0x12:
    local_98.field_2._M_allocated_capacity._0_2_ = 0x3d3e;
LAB_0013ec36:
    local_98._M_string_length = 2;
    local_98.field_2._M_local_buf[2] = 0;
    goto LAB_0013ec44;
  case 0x1c:
    local_98.field_2._M_allocated_capacity._0_2_ = 0x3c;
    break;
  case 0x1d:
    local_98.field_2._M_allocated_capacity._0_2_ = 0x3d;
    break;
  case 0x1e:
    local_98.field_2._M_allocated_capacity._0_2_ = 0x3e;
  }
LAB_0013ec24:
  local_98._M_string_length = 1;
LAB_0013ec44:
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x1a6911);
  local_78 = &local_68;
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_68 = *plVar6;
    lStack_60 = plVar5[3];
  }
  else {
    local_68 = *plVar6;
    local_78 = (long *)*plVar5;
  }
  local_70 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
LAB_0013ecb3:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar7) {
    lVar2 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  uVar10 = local_98.field_2._M_allocated_capacity;
  _Var11._M_p = local_98._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
LAB_0013ed17:
    operator_delete(_Var11._M_p,uVar10 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string token_got_string(Token t)
	{
		switch (t.type)
		{
			case Token::Invalid:    return "invalid token";
			case Token::Identifier: return "identifier '" + std::string(t.data) + "'";
			case Token::String:     return "string '" + cut_string(t.data) + "'";
			case Token::Integer:    return "integer '" + std::string(t.data) + "'";
			case Token::Float:      return "float '" + std::string(t.data) + "'";
			case Token::Boolean:    return "boolean '" + std::string(bool(t.data) ? "true" : "false") + "'";
			case Token::Operator:   return "operator '" + op_to_string(int(t.data)) + "'";
			case Token::Symbol:     return "symbol '" + std::string(t.data) + "'";
			case Token::NewLine:    return "new-line";
			case Token::EndOfFile:  return "end of file";
		}

		return "unknown token";
	}